

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_16af90::setInputDeepFrameBuffer
               (DeepFrameBuffer *frameBuffer,int pixelType,Array2D<unsigned_int_*> *uData,
               Array2D<float_*> *fData,Array2D<Imath_3_2::half_*> *hData,int width,int height)

{
  uint **ppuVar1;
  float **ppfVar2;
  half **pphVar3;
  Array2D<float_*> *in_RCX;
  Array2D<unsigned_int_*> *in_RDX;
  int in_ESI;
  char *in_RDI;
  Array2D<Imath_3_2::half_*> *in_R8;
  int in_R9D;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  long in_stack_ffffffffffffff08;
  Array2D<Imath_3_2::half_*> *in_stack_ffffffffffffff10;
  DeepSlice local_d8 [56];
  DeepSlice local_a0 [56];
  DeepSlice local_68 [60];
  int local_2c;
  Array2D<Imath_3_2::half_*> *local_28;
  Array2D<float_*> *local_20;
  Array2D<unsigned_int_*> *local_18;
  char *local_8;
  
  local_2c = in_R9D;
  local_8 = in_RDI;
  if (in_ESI == 0) {
    local_18 = in_RDX;
    Imf_3_2::Array2D<unsigned_int_*>::resizeErase
              ((Array2D<unsigned_int_*> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    ppuVar1 = Imf_3_2::Array2D<unsigned_int_*>::operator[](local_18,0);
    Imf_3_2::DeepSlice::DeepSlice
              (local_68,UINT,(char *)ppuVar1,8,(long)local_2c << 3,4,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert(local_8,(DeepSlice *)"UINT");
  }
  else if (in_ESI == 1) {
    local_20 = in_RCX;
    Imf_3_2::Array2D<float_*>::resizeErase
              ((Array2D<float_*> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    ppfVar2 = Imf_3_2::Array2D<float_*>::operator[](local_20,0);
    Imf_3_2::DeepSlice::DeepSlice
              (local_a0,FLOAT,(char *)ppfVar2,8,(long)local_2c << 3,4,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert(local_8,(DeepSlice *)"FLOAT");
  }
  else if (in_ESI == 2) {
    local_28 = in_R8;
    Imf_3_2::Array2D<Imath_3_2::half_*>::resizeErase
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    pphVar3 = Imf_3_2::Array2D<Imath_3_2::half_*>::operator[](local_28,0);
    Imf_3_2::DeepSlice::DeepSlice
              (local_d8,HALF,(char *)pphVar3,8,(long)local_2c << 3,2,1,1,0.0,false,false);
    Imf_3_2::DeepFrameBuffer::insert(local_8,(DeepSlice *)"HALF");
  }
  return;
}

Assistant:

void
setInputDeepFrameBuffer (
    DeepFrameBuffer&        frameBuffer,
    int                     pixelType,
    Array2D<unsigned int*>& uData,
    Array2D<float*>&        fData,
    Array2D<half*>&         hData,
    int                     width,
    int                     height)
{
    switch (pixelType)
    {
        case 0:
            uData.resizeErase (height, width);
            frameBuffer.insert (
                "UINT",
                DeepSlice (
                    IMF::UINT,
                    (char*) (&uData[0][0]),
                    sizeof (uData[0][0]) * 1,
                    sizeof (uData[0][0]) * width,
                    sizeof (unsigned int)));
            break;
        case 1:
            fData.resizeErase (height, width);
            frameBuffer.insert (
                "FLOAT",
                DeepSlice (
                    IMF::FLOAT,
                    (char*) (&fData[0][0]),
                    sizeof (fData[0][0]) * 1,
                    sizeof (fData[0][0]) * width,
                    sizeof (float)));
            break;
        case 2:
            hData.resizeErase (height, width);
            frameBuffer.insert (
                "HALF",
                DeepSlice (
                    IMF::HALF,
                    (char*) (&hData[0][0]),
                    sizeof (hData[0][0]) * 1,
                    sizeof (hData[0][0]) * width,
                    sizeof (half)));
            break;
    }
}